

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O0

bool requireDeviceLinking(cmGeneratorTarget *target,cmLocalGenerator *lg,string *config)

{
  cmLocalGenerator *pcVar1;
  bool bVar2;
  TargetType TVar3;
  cmGlobalGenerator *this;
  char *pcVar4;
  cmOutputConverter *local_220;
  cmStateSnapshot local_1a0;
  cmStateDirectory local_188;
  undefined1 local_160 [8];
  cmLinkLineDeviceComputer deviceLinkComputer;
  cmComputeLinkInformation *pcli;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  undefined1 local_f1;
  LinkClosure *pLStack_f0;
  bool closureHasCUDA;
  LinkClosure *closure;
  undefined1 local_e0 [8];
  string cuda_lang;
  undefined1 local_b8 [6];
  bool doDeviceLinking;
  char *local_98;
  char *separableCompilation;
  string local_88;
  char *local_68;
  char *resolveDeviceSymbols;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *config_local;
  cmLocalGenerator *lg_local;
  cmGeneratorTarget *target_local;
  
  local_28 = config;
  config_local = (string *)lg;
  lg_local = (cmLocalGenerator *)target;
  this = cmGeneratorTarget::GetGlobalGenerator(target);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"CUDA",&local_49);
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lg_local);
    pcVar1 = lg_local;
    if (TVar3 == OBJECT_LIBRARY) {
      target_local._7_1_ = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"CUDA_RESOLVE_DEVICE_SYMBOLS",
                 (allocator<char> *)((long)&separableCompilation + 7));
      pcVar4 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)pcVar1,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&separableCompilation + 7));
      pcVar1 = lg_local;
      local_68 = pcVar4;
      if (pcVar4 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b8,"CUDA_SEPARABLE_COMPILATION",
                   (allocator<char> *)(cuda_lang.field_2._M_local_buf + 0xf));
        pcVar4 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)pcVar1,(string *)local_b8);
        std::__cxx11::string::~string((string *)local_b8);
        std::allocator<char>::~allocator((allocator<char> *)(cuda_lang.field_2._M_local_buf + 0xf));
        local_98 = pcVar4;
        if ((pcVar4 == (char *)0x0) || (bVar2 = cmSystemTools::IsOn(pcVar4), !bVar2)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_e0,"CUDA",(allocator<char> *)((long)&closure + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&closure + 7));
          pLStack_f0 = cmGeneratorTarget::GetLinkClosure((cmGeneratorTarget *)lg_local,local_28);
          local_108._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&pLStack_f0->Languages);
          local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end(&pLStack_f0->Languages);
          local_100 = std::
                      find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                (local_108,
                                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_110,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_e0);
          pcli = (cmComputeLinkInformation *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&pLStack_f0->Languages);
          local_f1 = __gnu_cxx::operator!=
                               (&local_100,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&pcli);
          if ((bool)local_f1) {
            deviceLinkComputer.super_cmLinkLineComputer._56_8_ =
                 cmGeneratorTarget::GetLinkInformation((cmGeneratorTarget *)lg_local,local_28);
            if ((cmComputeLinkInformation *)deviceLinkComputer.super_cmLinkLineComputer._56_8_ ==
                (cmComputeLinkInformation *)0x0) {
              target_local._7_1_ = 1;
            }
            else {
              local_220 = (cmOutputConverter *)0x0;
              if (config_local != (string *)0x0) {
                local_220 = (cmOutputConverter *)&config_local->_M_string_length;
              }
              cmLocalGenerator::GetStateSnapshot(&local_1a0,(cmLocalGenerator *)config_local);
              cmStateSnapshot::GetDirectory(&local_188,&local_1a0);
              cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
                        ((cmLinkLineDeviceComputer *)local_160,local_220,&local_188);
              target_local._7_1_ =
                   cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
                             ((cmLinkLineDeviceComputer *)local_160,
                              (cmComputeLinkInformation *)
                              deviceLinkComputer.super_cmLinkLineComputer._56_8_);
              cmLinkLineDeviceComputer::~cmLinkLineDeviceComputer
                        ((cmLinkLineDeviceComputer *)local_160);
            }
          }
          else {
            target_local._7_1_ = 0;
          }
          std::__cxx11::string::~string((string *)local_e0);
        }
        else {
          cuda_lang.field_2._M_local_buf[0xe] = '\0';
          TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lg_local);
          if ((TVar3 == EXECUTABLE) || (TVar3 - SHARED_LIBRARY < 2)) {
            cuda_lang.field_2._M_local_buf[0xe] = '\x01';
          }
          target_local._7_1_ = cuda_lang.field_2._M_local_buf[0xe] & 1;
        }
      }
      else {
        target_local._7_1_ = cmSystemTools::IsOn(pcVar4);
      }
    }
  }
  else {
    target_local._7_1_ = 0;
  }
  return (bool)(target_local._7_1_ & 1);
}

Assistant:

bool requireDeviceLinking(cmGeneratorTarget& target, cmLocalGenerator& lg,
                          const std::string& config)
{
  if (!target.GetGlobalGenerator()->GetLanguageEnabled("CUDA")) {
    return false;
  }

  if (target.GetType() == cmStateEnums::OBJECT_LIBRARY) {
    return false;
  }

  if (const char* resolveDeviceSymbols =
        target.GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
    // If CUDA_RESOLVE_DEVICE_SYMBOLS has been explicitly set we need
    // to honor the value no matter what it is.
    return cmSystemTools::IsOn(resolveDeviceSymbols);
  }

  if (const char* separableCompilation =
        target.GetProperty("CUDA_SEPARABLE_COMPILATION")) {
    if (cmSystemTools::IsOn(separableCompilation)) {
      bool doDeviceLinking = false;
      switch (target.GetType()) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::EXECUTABLE:
          doDeviceLinking = true;
          break;
        default:
          break;
      }
      return doDeviceLinking;
    }
  }

  // Determine if we have any dependencies that require
  // us to do a device link step
  const std::string cuda_lang("CUDA");
  cmGeneratorTarget::LinkClosure const* closure =
    target.GetLinkClosure(config);

  bool closureHasCUDA =
    (std::find(closure->Languages.begin(), closure->Languages.end(),
               cuda_lang) != closure->Languages.end());
  if (closureHasCUDA) {
    cmComputeLinkInformation* pcli = target.GetLinkInformation(config);
    if (pcli) {
      cmLinkLineDeviceComputer deviceLinkComputer(
        &lg, lg.GetStateSnapshot().GetDirectory());
      return deviceLinkComputer.ComputeRequiresDeviceLinking(*pcli);
    }
    return true;
  }
  return false;
}